

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O2

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRnglist::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRnglist *this,
          Optional<llvm::object::SectionedAddress> BaseAddr,DWARFUnit *U)

{
  undefined1 auVar1 [16];
  uint8_t uVar2;
  pointer pRVar3;
  SectionedAddress *pSVar4;
  pointer pRVar5;
  undefined1 auVar6 [16];
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_68;
  char local_58;
  vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_> *local_50;
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_48;
  uint64_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar5 = (this->super_DWARFListType<llvm::RangeListEntry>).Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar3 = (this->super_DWARFListType<llvm::RangeListEntry>).Entries.
           super__Vector_base<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_50 = __return_storage_ptr__;
  do {
    if (pRVar5 == pRVar3) {
      return __return_storage_ptr__;
    }
    uVar2 = (pRVar5->super_DWARFListEntryBase).EntryKind;
    if (uVar2 == '\x01') {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)&local_48.value,U,
                 (uint32_t)pRVar5->Value0);
      BaseAddr.Storage.hasVal = SUB81(local_38,0);
      BaseAddr.Storage._17_7_ = SUB87(local_38 >> 8,0);
      BaseAddr.Storage.field_0.value.Address = local_48.value.Address;
      BaseAddr.Storage.field_0.value.SectionIndex = local_48.value.SectionIndex;
      if (BaseAddr.Storage.hasVal == false) {
        BaseAddr.Storage.field_0.value.Address = pRVar5->Value0;
        BaseAddr.Storage.field_0.value.SectionIndex = 0xffffffffffffffff;
LAB_00d94ca7:
        BaseAddr.Storage.hasVal = true;
      }
    }
    else if (uVar2 == '\x05') {
      auVar1 = *(undefined1 (*) [16])&(pRVar5->super_DWARFListEntryBase).SectionIndex;
      auVar6._0_8_ = auVar1._8_8_;
      auVar6._8_4_ = auVar1._0_4_;
      auVar6._12_4_ = auVar1._4_4_;
      BaseAddr.Storage.field_0.value.SectionIndex = auVar6._8_8_;
      BaseAddr.Storage.field_0.value.Address = auVar6._0_8_;
      if (BaseAddr.Storage.hasVal == false) goto LAB_00d94ca7;
    }
    else {
      if (uVar2 == '\0') {
        return __return_storage_ptr__;
      }
      local_38 = (pRVar5->super_DWARFListEntryBase).SectionIndex;
      if ((local_38 == 0xffffffffffffffff & BaseAddr.Storage.hasVal) == 1) {
        pSVar4 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           (&BaseAddr.Storage);
        local_38 = pSVar4->SectionIndex;
        uVar2 = (pRVar5->super_DWARFListEntryBase).EntryKind;
      }
      switch(uVar2) {
      case '\x03':
        DWARFUnit::getAddrOffsetSectionItem
                  ((Optional<llvm::object::SectionedAddress> *)&local_68.value,U,
                   (uint32_t)pRVar5->Value0);
        if (local_58 == '\0') {
          local_68.value.Address = 0;
          local_68.value.SectionIndex = 0xffffffffffffffff;
          local_58 = '\x01';
        }
        pSVar4 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           ((OptionalStorage<llvm::object::SectionedAddress,_true> *)&local_68.value
                           );
        local_38 = pSVar4->SectionIndex;
        pSVar4 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                           ((OptionalStorage<llvm::object::SectionedAddress,_true> *)&local_68.value
                           );
        local_48.value.Address = pSVar4->Address;
        local_48.value.SectionIndex = local_48.value.Address + pRVar5->Value1;
        __return_storage_ptr__ = local_50;
        break;
      case '\x04':
        local_48.value.Address = pRVar5->Value0;
        local_48.value.SectionIndex = pRVar5->Value1;
        if (BaseAddr.Storage.hasVal == true) {
          pSVar4 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                             (&BaseAddr.Storage);
          local_48.value.Address = local_48.value.Address + pSVar4->Address;
          pSVar4 = optional_detail::OptionalStorage<llvm::object::SectionedAddress,_true>::getValue
                             (&BaseAddr.Storage);
          local_48.value.SectionIndex = local_48.value.SectionIndex + pSVar4->Address;
        }
        break;
      default:
        llvm_unreachable_internal
                  ("Unsupported range list encoding",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                   ,0xa6);
      case '\x06':
        local_48.value.Address = pRVar5->Value0;
        local_48.value.SectionIndex = pRVar5->Value1;
        break;
      case '\a':
        local_48.value.Address = pRVar5->Value0;
        local_48.value.SectionIndex = local_48.value.Address + pRVar5->Value1;
      }
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::push_back
                (__return_storage_ptr__,(value_type *)&local_48.value);
    }
    pRVar5 = pRVar5 + 1;
  } while( true );
}

Assistant:

DWARFAddressRangesVector DWARFDebugRnglist::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr, DWARFUnit &U) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.EntryKind == dwarf::DW_RLE_end_of_list)
      break;
    if (RLE.EntryKind == dwarf::DW_RLE_base_addressx) {
      BaseAddr = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!BaseAddr)
        BaseAddr = {RLE.Value0, -1ULL};
      continue;
    }
    if (RLE.EntryKind == dwarf::DW_RLE_base_address) {
      BaseAddr = {RLE.Value0, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.SectionIndex = RLE.SectionIndex;
    if (BaseAddr && E.SectionIndex == -1ULL)
      E.SectionIndex = BaseAddr->SectionIndex;

    switch (RLE.EntryKind) {
    case dwarf::DW_RLE_offset_pair:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      if (BaseAddr) {
        E.LowPC += BaseAddr->Address;
        E.HighPC += BaseAddr->Address;
      }
      break;
    case dwarf::DW_RLE_start_end:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      break;
    case dwarf::DW_RLE_start_length:
      E.LowPC = RLE.Value0;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    case dwarf::DW_RLE_startx_length: {
      auto Start = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!Start)
        Start = {0, -1ULL};
      E.SectionIndex = Start->SectionIndex;
      E.LowPC = Start->Address;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    }
    default:
      // Unsupported encodings should have been reported during extraction,
      // so we should not run into any here.
      llvm_unreachable("Unsupported range list encoding");
    }
    Res.push_back(E);
  }
  return Res;
}